

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::OutputLinkLibraries
          (cmLocalGenerator *this,string *linkLibraries,string *frameworkPath,string *linkPath,
          cmGeneratorTarget *tgt,bool relink,bool forResponseFile,bool useWatcomQuote)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmMakefile *pcVar1;
  bool bVar2;
  TargetType TVar3;
  PolicyStatus PVar4;
  char *pcVar5;
  cmComputeLinkInformation *this_01;
  cmState *this_02;
  reference pbVar6;
  pointer pIVar7;
  ulong uVar8;
  reference source;
  string *psVar9;
  ostream *poVar10;
  PolicyID id;
  PolicyID id_00;
  bool local_8aa;
  bool local_875;
  OutputFormat local_804;
  string local_7e8 [32];
  char *local_7c8;
  char *stdLibs;
  allocator local_799;
  undefined1 local_798 [8];
  string standardLibsVar;
  undefined1 local_758 [8];
  string rpath_link;
  undefined1 local_718 [8];
  string rpath_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_6d8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_6d0;
  iterator ri;
  string rpath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  runtimeDirs;
  __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
  local_670;
  __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
  local_668;
  const_iterator li;
  ItemVector *items;
  undefined1 local_638 [8];
  string libpath;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_610;
  const_iterator libDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *libDirs;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5e0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5d8;
  const_iterator fdi;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *fwDirs;
  char *fwSearchFlag;
  undefined1 local_5b8 [8];
  string fwSearchFlagVar;
  undefined1 local_590 [8];
  string linkFlagsVar;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  undefined1 local_4e8 [8];
  ostringstream w;
  allocator local_369;
  string local_368;
  allocator local_341;
  string local_340;
  byte local_31c;
  byte local_31b;
  byte local_31a;
  allocator local_319;
  undefined1 local_318 [4];
  bool add_shlib_flags;
  allocator local_2f2;
  allocator local_2f1;
  string local_2f0;
  string local_2d0 [8];
  string libPathTerminator;
  string local_2a8;
  undefined1 local_288 [8];
  string libPathFlag;
  string linkLanguage;
  string linkLibs;
  cmComputeLinkInformation *cli;
  cmComputeLinkInformation *pcli;
  allocator local_1f9;
  string local_1f8;
  undefined1 local_1d8 [8];
  string config;
  ostringstream fout;
  bool escapeAllowMakeVars;
  OutputFormat shellFormat;
  bool useWatcomQuote_local;
  bool forResponseFile_local;
  bool relink_local;
  cmGeneratorTarget *tgt_local;
  string *linkPath_local;
  string *frameworkPath_local;
  string *linkLibraries_local;
  cmLocalGenerator *this_local;
  
  if (forResponseFile) {
    local_804 = RESPONSE;
  }
  else {
    local_804 = SHELL;
    if (useWatcomQuote) {
      local_804 = WATCOMQUOTE;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(config.field_2._M_local_buf + 8));
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f8,"CMAKE_BUILD_TYPE",&local_1f9);
  pcVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_1f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_1d8,pcVar5,(allocator *)((long)&pcli + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&pcli + 3));
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  this_01 = cmGeneratorTarget::GetLinkInformation(tgt,(string *)local_1d8);
  if (this_01 != (cmComputeLinkInformation *)0x0) {
    std::__cxx11::string::string((string *)(linkLanguage.field_2._M_local_buf + 8));
    cmComputeLinkInformation::GetLinkLanguage_abi_cxx11_
              ((string *)((long)&libPathFlag.field_2 + 8),this_01);
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_2a8,"CMAKE_LIBRARY_PATH_FLAG",
               (allocator *)(libPathTerminator.field_2._M_local_buf + 0xf));
    pcVar5 = cmMakefile::GetRequiredDefinition(pcVar1,&local_2a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_288,pcVar5,
               (allocator *)(libPathTerminator.field_2._M_local_buf + 0xe));
    std::allocator<char>::~allocator
              ((allocator<char> *)(libPathTerminator.field_2._M_local_buf + 0xe));
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator
              ((allocator<char> *)(libPathTerminator.field_2._M_local_buf + 0xf));
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2f0,"CMAKE_LIBRARY_PATH_TERMINATOR",&local_2f1);
    pcVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_2f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2d0,pcVar5,&local_2f2);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f2);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
    local_31a = 0;
    local_31b = 0;
    TVar3 = cmGeneratorTarget::GetType(tgt);
    local_875 = false;
    if (TVar3 == EXECUTABLE) {
      this_02 = cmState::Snapshot::GetState(&this->StateSnapshot);
      std::allocator<char>::allocator();
      local_31a = 1;
      std::__cxx11::string::string((string *)local_318,"TARGET_SUPPORTS_SHARED_LIBS",&local_319);
      local_31b = 1;
      local_875 = cmState::GetGlobalPropertyAsBool(this_02,(string *)local_318);
    }
    if ((local_31b & 1) != 0) {
      std::__cxx11::string::~string((string *)local_318);
    }
    if ((local_31a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_319);
    }
    if (local_875 != false) {
      local_31c = 0;
      PVar4 = cmGeneratorTarget::GetPolicyStatusCMP0065(tgt);
      switch(PVar4) {
      case WARN:
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_340,"ENABLE_EXPORTS",&local_341);
        bVar2 = cmGeneratorTarget::GetPropertyAsBool(tgt,&local_340);
        local_8aa = false;
        if (!bVar2) {
          pcVar1 = this->Makefile;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_368,"CMAKE_POLICY_WARNING_CMP0065",&local_369);
          local_8aa = cmMakefile::PolicyOptionalWarningEnabled(pcVar1,&local_368);
          std::__cxx11::string::~string((string *)&local_368);
          std::allocator<char>::~allocator((allocator<char> *)&local_369);
        }
        std::__cxx11::string::~string((string *)&local_340);
        std::allocator<char>::~allocator((allocator<char> *)&local_341);
        if (local_8aa != false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4e8);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_508,(cmPolicies *)0x41,id_00);
          poVar10 = std::operator<<((ostream *)local_4e8,(string *)&local_508);
          std::operator<<(poVar10,
                          "\nFor compatibility with older versions of CMake, additional flags may be added to export symbols on all executables regardless of thier ENABLE_EXPORTS property."
                         );
          std::__cxx11::string::~string((string *)&local_508);
          pcVar1 = this->Makefile;
          std::__cxx11::ostringstream::str();
          cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_528,false);
          std::__cxx11::string::~string((string *)&local_528);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4e8);
        }
      case OLD:
        local_31c = 1;
        break;
      case REQUIRED_IF_USED:
      case REQUIRED_ALWAYS:
        pcVar1 = this->Makefile;
        cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_548,(cmPolicies *)0x41,id);
        cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_548,false);
        std::__cxx11::string::~string((string *)&local_548);
      case NEW:
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_568,"ENABLE_EXPORTS",
                   (allocator *)(linkFlagsVar.field_2._M_local_buf + 0xf));
        local_31c = cmGeneratorTarget::GetPropertyAsBool(tgt,&local_568);
        std::__cxx11::string::~string((string *)&local_568);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(linkFlagsVar.field_2._M_local_buf + 0xf));
      }
      if ((local_31c & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_590,"CMAKE_SHARED_LIBRARY_LINK_",
                   (allocator *)(fwSearchFlagVar.field_2._M_local_buf + 0xf));
        std::allocator<char>::~allocator
                  ((allocator<char> *)(fwSearchFlagVar.field_2._M_local_buf + 0xf));
        std::__cxx11::string::operator+=
                  ((string *)local_590,(string *)(libPathFlag.field_2._M_local_buf + 8));
        std::__cxx11::string::operator+=((string *)local_590,"_FLAGS");
        pcVar5 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_590);
        std::__cxx11::string::operator=((string *)(linkLanguage.field_2._M_local_buf + 8),pcVar5);
        std::__cxx11::string::operator+=((string *)(linkLanguage.field_2._M_local_buf + 8)," ");
        std::__cxx11::string::~string((string *)local_590);
      }
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_5b8,"CMAKE_",(allocator *)((long)&fwSearchFlag + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&fwSearchFlag + 7));
    std::__cxx11::string::operator+=
              ((string *)local_5b8,(string *)(libPathFlag.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_5b8,"_FRAMEWORK_SEARCH_FLAG");
    pcVar5 = cmMakefile::GetDefinition(this->Makefile,(string *)local_5b8);
    if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
      fdi._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           cmComputeLinkInformation::GetFrameworkPaths_abi_cxx11_(this_01);
      local_5d8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)fdi._M_current);
      while( true ) {
        local_5e0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(fdi._M_current);
        bVar2 = __gnu_cxx::operator!=(&local_5d8,&local_5e0);
        if (!bVar2) break;
        std::__cxx11::string::operator+=((string *)frameworkPath,pcVar5);
        pbVar6 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_5d8);
        cmOutputConverter::Convert
                  ((string *)&libDirs,&this->super_cmOutputConverter,pbVar6,NONE,local_804);
        std::__cxx11::string::operator+=((string *)frameworkPath,(string *)&libDirs);
        std::__cxx11::string::~string((string *)&libDirs);
        std::__cxx11::string::operator+=((string *)frameworkPath," ");
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_5d8);
      }
    }
    libDir._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         cmComputeLinkInformation::GetDirectories_abi_cxx11_(this_01);
    local_610._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)libDir._M_current);
    while( true ) {
      libpath.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)libDir._M_current);
      bVar2 = __gnu_cxx::operator!=
                        (&local_610,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&libpath.field_2 + 8));
      if (!bVar2) break;
      pbVar6 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_610);
      cmOutputConverter::ConvertToOutputForExisting
                ((string *)local_638,&this->super_cmOutputConverter,pbVar6,START_OUTPUT,local_804);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&items," "
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_288
                    );
      std::__cxx11::string::operator+=((string *)linkPath,(string *)&items);
      std::__cxx11::string::~string((string *)&items);
      std::__cxx11::string::operator+=((string *)linkPath,(string *)local_638);
      std::__cxx11::string::operator+=((string *)linkPath,local_2d0);
      std::__cxx11::string::operator+=((string *)linkPath," ");
      std::__cxx11::string::~string((string *)local_638);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_610);
    }
    li._M_current = (Item *)cmComputeLinkInformation::GetItems(this_01);
    local_668._M_current =
         (Item *)std::
                 vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                 ::begin((vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                          *)li._M_current);
    while( true ) {
      local_670._M_current =
           (Item *)std::
                   vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                   ::end(li._M_current);
      bVar2 = __gnu_cxx::operator!=(&local_668,&local_670);
      if (!bVar2) break;
      pIVar7 = __gnu_cxx::
               __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
               ::operator->(&local_668);
      if (pIVar7->Target == (cmGeneratorTarget *)0x0) {
LAB_006b4d5b:
        pIVar7 = __gnu_cxx::
                 __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                 ::operator->(&local_668);
        if ((pIVar7->IsPath & 1U) == 0) {
          pIVar7 = __gnu_cxx::
                   __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                   ::operator->(&local_668);
          std::__cxx11::string::operator+=
                    ((string *)(linkLanguage.field_2._M_local_buf + 8),(string *)pIVar7);
        }
        else {
          pIVar7 = __gnu_cxx::
                   __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                   ::operator->(&local_668);
          (*this->_vptr_cmLocalGenerator[0xd])
                    (&runtimeDirs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,this,pIVar7);
          std::__cxx11::string::operator+=
                    ((string *)(linkLanguage.field_2._M_local_buf + 8),
                     (string *)
                     &runtimeDirs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::~string
                    ((string *)
                     &runtimeDirs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        std::__cxx11::string::operator+=((string *)(linkLanguage.field_2._M_local_buf + 8)," ");
      }
      else {
        pIVar7 = __gnu_cxx::
                 __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                 ::operator->(&local_668);
        TVar3 = cmGeneratorTarget::GetType(pIVar7->Target);
        if (TVar3 != INTERFACE_LIBRARY) goto LAB_006b4d5b;
      }
      __gnu_cxx::
      __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
      ::operator++(&local_668);
    }
    std::operator<<((ostream *)((long)&config.field_2 + 8),
                    (string *)(linkLanguage.field_2._M_local_buf + 8));
    cmComputeLinkInformation::GetRuntimeSep_abi_cxx11_(this_01);
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      cmComputeLinkInformation::GetRPathString_abi_cxx11_((string *)local_718,this_01,relink);
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        psVar9 = cmComputeLinkInformation::GetRuntimeFlag_abi_cxx11_(this_01);
        std::operator<<((ostream *)((long)&config.field_2 + 8),(string *)psVar9);
        cmOutputConverter::EscapeForShell
                  ((string *)((long)&rpath_link.field_2 + 8),&this->super_cmOutputConverter,
                   (string *)local_718,(bool)(~forResponseFile & 1U),false,false);
        std::operator<<((ostream *)((long)&config.field_2 + 8),
                        (string *)(rpath_link.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(rpath_link.field_2._M_local_buf + 8));
        std::operator<<((ostream *)((long)&config.field_2 + 8)," ");
      }
      std::__cxx11::string::~string((string *)local_718);
    }
    else {
      this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&rpath.field_2 + 8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(this_00);
      cmComputeLinkInformation::GetRPath(this_01,this_00,relink);
      std::__cxx11::string::string((string *)&ri);
      local_6d0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&rpath.field_2 + 8));
      while( true ) {
        local_6d8._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&rpath.field_2 + 8));
        bVar2 = __gnu_cxx::operator!=(&local_6d0,&local_6d8);
        if (!bVar2) break;
        psVar9 = cmComputeLinkInformation::GetRuntimeFlag_abi_cxx11_(this_01);
        std::__cxx11::string::operator+=((string *)&ri,(string *)psVar9);
        source = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_6d0);
        cmOutputConverter::Convert
                  ((string *)((long)&rpath_1.field_2 + 8),&this->super_cmOutputConverter,source,NONE
                   ,local_804);
        std::__cxx11::string::operator+=((string *)&ri,(string *)(rpath_1.field_2._M_local_buf + 8))
        ;
        std::__cxx11::string::~string((string *)(rpath_1.field_2._M_local_buf + 8));
        std::__cxx11::string::operator+=((string *)&ri," ");
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_6d0);
      }
      std::operator<<((ostream *)((long)&config.field_2 + 8),(string *)&ri);
      std::__cxx11::string::~string((string *)&ri);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&rpath.field_2 + 8));
    }
    cmComputeLinkInformation::GetRPathLinkString_abi_cxx11_((string *)local_758,this_01);
    cmComputeLinkInformation::GetRPathLinkFlag_abi_cxx11_(this_01);
    uVar8 = std::__cxx11::string::empty();
    if (((uVar8 & 1) == 0) && (uVar8 = std::__cxx11::string::empty(), (uVar8 & 1) == 0)) {
      psVar9 = cmComputeLinkInformation::GetRPathLinkFlag_abi_cxx11_(this_01);
      std::operator<<((ostream *)((long)&config.field_2 + 8),(string *)psVar9);
      cmOutputConverter::EscapeForShell
                ((string *)((long)&standardLibsVar.field_2 + 8),&this->super_cmOutputConverter,
                 (string *)local_758,(bool)(~forResponseFile & 1U),false,false);
      std::operator<<((ostream *)((long)&config.field_2 + 8),
                      (string *)(standardLibsVar.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(standardLibsVar.field_2._M_local_buf + 8));
      std::operator<<((ostream *)((long)&config.field_2 + 8)," ");
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_798,"CMAKE_",&local_799);
    std::allocator<char>::~allocator((allocator<char> *)&local_799);
    cmComputeLinkInformation::GetLinkLanguage_abi_cxx11_((string *)&stdLibs,this_01);
    std::__cxx11::string::operator+=((string *)local_798,(string *)&stdLibs);
    std::__cxx11::string::~string((string *)&stdLibs);
    std::__cxx11::string::operator+=((string *)local_798,"_STANDARD_LIBRARIES");
    local_7c8 = cmMakefile::GetDefinition(this->Makefile,(string *)local_798);
    if (local_7c8 != (char *)0x0) {
      poVar10 = std::operator<<((ostream *)((long)&config.field_2 + 8),local_7c8);
      std::operator<<(poVar10," ");
    }
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)linkLibraries,local_7e8);
    std::__cxx11::string::~string(local_7e8);
    std::__cxx11::string::~string((string *)local_798);
    std::__cxx11::string::~string((string *)local_758);
    std::__cxx11::string::~string((string *)local_5b8);
    std::__cxx11::string::~string(local_2d0);
    std::__cxx11::string::~string((string *)local_288);
    std::__cxx11::string::~string((string *)(libPathFlag.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(linkLanguage.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(config.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmLocalGenerator::OutputLinkLibraries(std::string& linkLibraries,
                                           std::string& frameworkPath,
                                           std::string& linkPath,
                                           cmGeneratorTarget &tgt,
                                           bool relink,
                                           bool forResponseFile,
                                           bool useWatcomQuote)
{
  OutputFormat shellFormat = (forResponseFile) ? RESPONSE :
                             ((useWatcomQuote) ? WATCOMQUOTE : SHELL);
  bool escapeAllowMakeVars = !forResponseFile;
  std::ostringstream fout;
  std::string config = this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
  cmComputeLinkInformation* pcli = tgt.GetLinkInformation(config);
  if(!pcli)
    {
    return;
    }
  cmComputeLinkInformation& cli = *pcli;

  // Collect library linking flags command line options.
  std::string linkLibs;

  std::string linkLanguage = cli.GetLinkLanguage();

  std::string libPathFlag =
    this->Makefile->GetRequiredDefinition("CMAKE_LIBRARY_PATH_FLAG");
  std::string libPathTerminator =
    this->Makefile->GetSafeDefinition("CMAKE_LIBRARY_PATH_TERMINATOR");

  // Flags to link an executable to shared libraries.
  if (tgt.GetType() == cmState::EXECUTABLE &&
      this->StateSnapshot.GetState()->
        GetGlobalPropertyAsBool("TARGET_SUPPORTS_SHARED_LIBS"))
    {
    bool add_shlib_flags = false;
    switch(tgt.GetPolicyStatusCMP0065())
      {
      case cmPolicies::WARN:
        if(!tgt.GetPropertyAsBool("ENABLE_EXPORTS") &&
           this->Makefile->PolicyOptionalWarningEnabled(
             "CMAKE_POLICY_WARNING_CMP0065"))
          {
          std::ostringstream w;
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0065) << "\n"
            "For compatibility with older versions of CMake, "
            "additional flags may be added to export symbols on all "
            "executables regardless of thier ENABLE_EXPORTS property.";
          this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, w.str());
          }
      case cmPolicies::OLD:
        // OLD behavior is to always add the flags
        add_shlib_flags = true;
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        this->Makefile->IssueMessage(
          cmake::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0065)
          );
      case cmPolicies::NEW:
        // NEW behavior is to only add the flags if ENABLE_EXPORTS is on
        add_shlib_flags = tgt.GetPropertyAsBool("ENABLE_EXPORTS");
        break;
      }

    if(add_shlib_flags)
      {
      std::string linkFlagsVar = "CMAKE_SHARED_LIBRARY_LINK_";
      linkFlagsVar += linkLanguage;
      linkFlagsVar += "_FLAGS";
      linkLibs = this->Makefile->GetSafeDefinition(linkFlagsVar);
      linkLibs += " ";
      }
    }

  // Append the framework search path flags.
  std::string fwSearchFlagVar = "CMAKE_";
  fwSearchFlagVar += linkLanguage;
  fwSearchFlagVar += "_FRAMEWORK_SEARCH_FLAG";
  const char* fwSearchFlag =
    this->Makefile->GetDefinition(fwSearchFlagVar);
  if(fwSearchFlag && *fwSearchFlag)
    {
    std::vector<std::string> const& fwDirs = cli.GetFrameworkPaths();
    for(std::vector<std::string>::const_iterator fdi = fwDirs.begin();
        fdi != fwDirs.end(); ++fdi)
      {
      frameworkPath += fwSearchFlag;
      frameworkPath += this->Convert(*fdi, NONE, shellFormat);
      frameworkPath += " ";
      }
    }

  // Append the library search path flags.
  std::vector<std::string> const& libDirs = cli.GetDirectories();
  for(std::vector<std::string>::const_iterator libDir = libDirs.begin();
      libDir != libDirs.end(); ++libDir)
    {
    std::string libpath = this->ConvertToOutputForExisting(*libDir,
                                                           START_OUTPUT,
                                                           shellFormat);
    linkPath += " " + libPathFlag;
    linkPath += libpath;
    linkPath += libPathTerminator;
    linkPath += " ";
    }

  // Append the link items.
  typedef cmComputeLinkInformation::ItemVector ItemVector;
  ItemVector const& items = cli.GetItems();
  for(ItemVector::const_iterator li = items.begin(); li != items.end(); ++li)
    {
    if(li->Target && li->Target->GetType() == cmState::INTERFACE_LIBRARY)
      {
      continue;
      }
    if(li->IsPath)
      {
      linkLibs += this->ConvertToLinkReference(li->Value, shellFormat);
      }
    else
      {
      linkLibs += li->Value;
      }
    linkLibs += " ";
    }

  // Write the library flags to the build rule.
  fout << linkLibs;

  // Check what kind of rpath flags to use.
  if(cli.GetRuntimeSep().empty())
    {
    // Each rpath entry gets its own option ("-R a -R b -R c")
    std::vector<std::string> runtimeDirs;
    cli.GetRPath(runtimeDirs, relink);

    std::string rpath;
    for(std::vector<std::string>::iterator ri = runtimeDirs.begin();
        ri != runtimeDirs.end(); ++ri)
      {
      rpath += cli.GetRuntimeFlag();
      rpath += this->Convert(*ri, NONE, shellFormat);
      rpath += " ";
      }
    fout << rpath;
    }
  else
    {
    // All rpath entries are combined ("-Wl,-rpath,a:b:c").
    std::string rpath = cli.GetRPathString(relink);

    // Store the rpath option in the stream.
    if(!rpath.empty())
      {
      fout << cli.GetRuntimeFlag();
      fout << this->EscapeForShell(rpath, escapeAllowMakeVars);
      fout << " ";
      }
    }

  // Add the linker runtime search path if any.
  std::string rpath_link = cli.GetRPathLinkString();
  if(!cli.GetRPathLinkFlag().empty() && !rpath_link.empty())
    {
    fout << cli.GetRPathLinkFlag();
    fout << this->EscapeForShell(rpath_link, escapeAllowMakeVars);
    fout << " ";
    }

  // Add standard libraries for this language.
  std::string standardLibsVar = "CMAKE_";
  standardLibsVar += cli.GetLinkLanguage();
  standardLibsVar += "_STANDARD_LIBRARIES";
  if(const char* stdLibs =
     this->Makefile->GetDefinition(standardLibsVar))
    {
    fout << stdLibs << " ";
    }

  linkLibraries = fout.str();
}